

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * get_family(xc_func_type *func)

{
  int iVar1;
  
  iVar1 = func->info->family;
  switch(iVar1) {
  case 0:
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_00e6a382_caseD_0;
  case 1:
    return "XC_FAMILY_LDA";
  case 2:
    return "XC_FAMILY_GGA";
  case 4:
    return "XC_FAMILY_MGGA";
  case 8:
    return "XC_FAMILY_LCA";
  case -1:
    return "XC_FAMILY_UNKNOWN";
  default:
    if (iVar1 == 0x10) {
      return "XC_FAMILY_OEP";
    }
    if (iVar1 == 0x20) {
      return "XC_FAMILY_HYB_GGA";
    }
    if (iVar1 == 0x40) {
      return "XC_FAMILY_HYB_MGGA";
    }
    if (iVar1 == 0x80) {
      return "XC_FAMILY_HYB_LDA";
    }
switchD_00e6a382_caseD_0:
    puts("Internal error in get_family.");
    return "";
  }
}

Assistant:

const char *get_family(const xc_func_type *func) {
  switch(func->info->family) {
    case(XC_FAMILY_UNKNOWN):
      return "XC_FAMILY_UNKNOWN";

    case(XC_FAMILY_LDA):
      return "XC_FAMILY_LDA";

    case(XC_FAMILY_HYB_LDA):
      return "XC_FAMILY_HYB_LDA";

    case(XC_FAMILY_GGA):
      return "XC_FAMILY_GGA";

    case(XC_FAMILY_HYB_GGA):
      return "XC_FAMILY_HYB_GGA";

    case(XC_FAMILY_MGGA):
      return "XC_FAMILY_MGGA";

    case(XC_FAMILY_HYB_MGGA):
      return "XC_FAMILY_HYB_MGGA";

    case(XC_FAMILY_LCA):
      return "XC_FAMILY_LCA";

    case(XC_FAMILY_OEP):
      return "XC_FAMILY_OEP";

    default:
      printf("Internal error in get_family.\n");
      return "";
  }
}